

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.h
# Opt level: O0

void __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
Destroy<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
          (RepeatedPtrFieldBase *this)

{
  bool bVar1;
  int iVar2;
  LogMessage *pLVar3;
  void **ppvVar4;
  Rep *p;
  int local_5c;
  int i;
  void **elems;
  int n;
  basic_string_view<char,_std::char_traits<char>_> local_38;
  LogMessageFatal local_28 [23];
  Voidify local_11;
  RepeatedPtrFieldBase *local_10;
  RepeatedPtrFieldBase *this_local;
  
  local_10 = this;
  bVar1 = NeedsDestroy(this);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_38,"NeedsDestroy()");
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              (local_28,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/repeated_ptr_field.h"
               ,0xdd,local_38._M_len,local_38._M_str);
    pLVar3 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_28);
    absl::lts_20240722::log_internal::Voidify::operator&&(&local_11,pLVar3);
    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_28);
  }
  if (this->arena_ == (Arena *)0x0) {
    iVar2 = allocated_size(this);
    ppvVar4 = elements(this);
    for (local_5c = 0; local_5c < iVar2; local_5c = local_5c + 1) {
      Delete<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                (ppvVar4[local_5c],(Arena *)0x0);
    }
    bVar1 = using_sso(this);
    if (!bVar1) {
      p = rep(this);
      iVar2 = Capacity(this);
      SizedDelete(p,(long)iVar2 * 8 + 8);
    }
  }
  return;
}

Assistant:

void Destroy() {
    ABSL_DCHECK(NeedsDestroy());

    // TODO: arena check is redundant once all `RepeatedPtrField`s
    // with non-null arena are owned by the arena.
    if (PROTOBUF_PREDICT_FALSE(arena_ != nullptr)) return;

    using H = CommonHandler<TypeHandler>;
    int n = allocated_size();
    void** elems = elements();
    for (int i = 0; i < n; i++) {
      Delete<H>(elems[i], nullptr);
    }
    if (!using_sso()) {
      internal::SizedDelete(rep(),
                            Capacity() * sizeof(elems[0]) + kRepHeaderSize);
    }
  }